

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration>::relocate
          (QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *this,qsizetype offset
          ,NamespaceDeclaration **data)

{
  NamespaceDeclaration *d_first;
  NamespaceDeclaration *pNVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QXmlStreamPrivateTagStack::NamespaceDeclaration,long_long>
            (this->ptr,this->size,d_first);
  if (data != (NamespaceDeclaration **)0x0) {
    pNVar1 = *data;
    if ((this->ptr <= pNVar1) && (pNVar1 < this->ptr + this->size)) {
      *data = pNVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }